

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O0

NTrodeObj * __thiscall TrodesConfig::getNTrode(TrodesConfig *this,int index)

{
  size_type sVar1;
  int in_EDX;
  NTrodeObj *in_RSI;
  NTrodeObj *in_RDI;
  int iVar2;
  NTrodeObj *this_00;
  
  iVar2 = in_EDX;
  this_00 = in_RSI;
  sVar1 = std::vector<NTrodeObj,_std::allocator<NTrodeObj>_>::size
                    ((vector<NTrodeObj,_std::allocator<NTrodeObj>_> *)
                     ((long)&(in_RSI->id).field_2 + 8));
  if (in_EDX < (int)sVar1) {
    std::vector<NTrodeObj,_std::allocator<NTrodeObj>_>::operator[]
              ((vector<NTrodeObj,_std::allocator<NTrodeObj>_> *)((long)&(in_RSI->id).field_2 + 8),
               (long)iVar2);
    NTrodeObj::NTrodeObj(this_00,(NTrodeObj *)CONCAT44(iVar2,in_EDX));
  }
  else {
    NTrodeObj::NTrodeObj(this_00);
  }
  return in_RDI;
}

Assistant:

NTrodeObj TrodesConfig::getNTrode(int index) const{
    if (index >= (int)nTrodes.size()) {
        return NTrodeObj();
    }
    return(nTrodes[index]);
}